

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControlPrivate::gotoNextTableCell(QWidgetTextControlPrivate *this)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QTextCursor::currentTable();
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  QTextTable::cellAt((QTextCursor *)&local_48);
  iVar3 = QTextTableCell::column();
  iVar4 = QTextTableCell::columnSpan();
  iVar5 = QTextTableCell::row();
  iVar6 = QTextTable::columns();
  if (iVar6 <= iVar4 + iVar3) {
    iVar3 = QTextTable::rows();
    if (iVar3 <= iVar5 + 1) {
      iVar3 = QTextTable::rows();
      QTextTable::insertRows(iVar2,iVar3);
    }
  }
  QTextTable::cellAt((int)&local_58,iVar2);
  local_48 = (undefined1 *)local_58;
  puStack_40 = (undefined1 *)CONCAT44(puStack_40._4_4_,local_50);
  QTextTableCell::firstCursorPosition();
  uVar1 = *(undefined8 *)&this->cursor;
  *(undefined8 *)&this->cursor = local_58;
  local_58 = uVar1;
  QTextCursor::~QTextCursor((QTextCursor *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControlPrivate::gotoNextTableCell()
{
    QTextTable *table = cursor.currentTable();
    QTextTableCell cell = table->cellAt(cursor);

    int newColumn = cell.column() + cell.columnSpan();
    int newRow = cell.row();

    if (newColumn >= table->columns()) {
        newColumn = 0;
        ++newRow;
        if (newRow >= table->rows())
            table->insertRows(table->rows(), 1);
    }

    cell = table->cellAt(newRow, newColumn);
    cursor = cell.firstCursorPosition();
}